

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O2

void run_collapse_task(parallel_task_1d *task,size_t thread_id)

{
  work_fn_t p_Var1;
  work_fn_t p_Var2;
  int iVar3;
  float fVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  work_item *pwVar9;
  bbox bbox;
  bbox bbox_00;
  bbox bbox_01;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  real_t rVar16;
  real_t rVar17;
  real_t rVar18;
  undefined8 in_stack_ffffffffffffff40;
  
  uVar12 = (task->range).begin;
  uVar5 = (task->range).end;
  do {
    if (uVar5 <= uVar12) {
      return;
    }
    uVar10 = (ulong)*(uint *)(task[1].work_item.work_fn + uVar12 * 0x20 + 0x18);
    if (uVar10 != 0) {
      *(ulong *)(task[1].range.begin + uVar12 * 8) = uVar10;
      uVar10 = uVar12;
      while( true ) {
        if (uVar10 == 0) {
          __assert_fail("node_index != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/accel/bvh.c"
                        ,0x17e,"size_t left_sibling(size_t)");
        }
        uVar6 = *(ulong *)(task[1].range.end + uVar10 * 8);
        if (uVar6 == 0xffffffffffffffff) break;
        LOCK();
        p_Var1 = task[2].work_item.work_fn + uVar6 * 4;
        iVar3 = *(int *)p_Var1;
        *(int *)p_Var1 = *(int *)p_Var1 + 1;
        UNLOCK();
        if (iVar3 == 0) break;
        uVar14 = (ulong)((uint)uVar10 & 1);
        uVar13 = (uVar10 + uVar14) - 1;
        p_Var1 = task[1].work_item.work_fn;
        lVar11 = uVar6 * 0x20;
        if (uVar13 != *(uint *)(p_Var1 + lVar11 + 0x1c)) {
          __assert_fail("first_child == parent->first_child_or_primitive",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/accel/bvh.c"
                        ,0x197,"void run_collapse_task(struct parallel_task_1d *, size_t)");
        }
        sVar7 = task[1].range.begin;
        uVar8 = *(ulong *)(sVar7 + uVar13 * 8);
        if (uVar8 == 0) break;
        lVar15 = uVar14 + uVar10;
        uVar14 = *(ulong *)(sVar7 + lVar15 * 8);
        if (uVar14 == 0) break;
        bbox.max._[0] = (real_t)*(undefined4 *)(p_Var1 + lVar11 + 0x14);
        bbox.min._[2] = (real_t)*(undefined4 *)(p_Var1 + lVar11 + 0xc);
        bbox.min._[1] = (real_t)*(undefined4 *)(p_Var1 + lVar11 + 4);
        bbox.min._[0] = (real_t)*(undefined4 *)(p_Var1 + lVar11 + 0x10);
        bbox.max._[1] = (real_t)(int)in_stack_ffffffffffffff40;
        bbox.max._[2] = (real_t)(int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
        rVar16 = half_bbox_area(bbox);
        fVar4 = *(float *)&task[2].work_item.next;
        p_Var2 = p_Var1 + uVar13 * 0x20 + 4;
        bbox_00.max._[0] = (real_t)*(undefined4 *)(p_Var1 + uVar13 * 0x20 + 0x14);
        bbox_00.min._[2] = (real_t)*(undefined4 *)(p_Var2 + 8);
        bbox_00.min._[1] = (real_t)*(undefined4 *)p_Var2;
        bbox_00.min._[0] = (real_t)*(undefined4 *)(p_Var2 + 0xc);
        bbox_00.max._[1] = (real_t)(int)in_stack_ffffffffffffff40;
        bbox_00.max._[2] = (real_t)(int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
        rVar17 = half_bbox_area(bbox_00);
        p_Var2 = p_Var1 + lVar15 * 0x20 + 4;
        bbox_01.max._[0] = (real_t)*(undefined4 *)(p_Var1 + lVar15 * 0x20 + 0x14);
        bbox_01.min._[2] = (real_t)*(undefined4 *)(p_Var2 + 8);
        bbox_01.min._[1] = (real_t)*(undefined4 *)p_Var2;
        bbox_01.min._[0] = (real_t)*(undefined4 *)(p_Var2 + 0xc);
        bbox_01.max._[1] = (real_t)(int)in_stack_ffffffffffffff40;
        bbox_01.max._[2] = (real_t)(int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
        rVar18 = half_bbox_area(bbox_01);
        uVar10 = uVar6;
        if (rVar16 * ((float)(uVar14 + uVar8) - fVar4) <
            rVar17 * (float)uVar8 + rVar18 * (float)uVar14) {
          *(ulong *)(sVar7 + uVar6 * 8) = uVar14 + uVar8;
          *(undefined8 *)(sVar7 + uVar13 * 8) = 0;
          *(undefined8 *)(sVar7 + lVar15 * 8) = 0;
          pwVar9 = task[1].work_item.next;
          *(undefined8 *)((long)pwVar9 + uVar13 * 8) = 0;
          (&pwVar9->work_fn)[lVar15] = (work_fn_t)0x0;
        }
      }
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static void run_collapse_task(struct parallel_task_1d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct collapse_task* collapse_task = (void*)task;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        const struct bvh_node* node = &collapse_task->nodes[i];
        if (node->primitive_count == 0)
            continue;

        collapse_task->primitive_counts[i] = node->primitive_count;

        // Walk up the parents of this node towards the root
        size_t j = i;
        while (true) {
            size_t first_child = left_sibling(j);
            j = collapse_task->parents[j];

            // Terminate this path if the root has been reached or the two children have not yet been processed
            if (j == SIZE_MAX || atomic_fetch_add_explicit(&collapse_task->flags[j], 1, memory_order_relaxed) == 0)
                break;

            const struct bvh_node* parent = &collapse_task->nodes[j];
            assert(first_child == parent->first_child_or_primitive);

            size_t left_count  = collapse_task->primitive_counts[first_child + 0];
            size_t right_count = collapse_task->primitive_counts[first_child + 1];
            // Both children must be leaves in order to collapse this node
            if (left_count == 0 || right_count == 0)
                break;

            const struct bvh_node* left  = &collapse_task->nodes[first_child + 0];
            const struct bvh_node* right = &collapse_task->nodes[first_child + 1];
            size_t total_count = left_count + right_count;
            float collapse_cost =
                half_bbox_area(get_bvh_node_bbox(parent)) * (total_count - collapse_task->traversal_cost);
            float cost =
                half_bbox_area(get_bvh_node_bbox(left))  * left_count +
                half_bbox_area(get_bvh_node_bbox(right)) * right_count;
            if (collapse_cost < cost) {
                collapse_task->primitive_counts[j] = total_count;
                collapse_task->primitive_counts[first_child + 0] = 0;
                collapse_task->primitive_counts[first_child + 1] = 0;
                collapse_task->node_counts[first_child + 0] = 0;
                collapse_task->node_counts[first_child + 1] = 0;
            }
        }
    }
}